

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5044e2::HKDFTest_TestVectors_Test::TestBody(HKDFTest_TestVectors_Test *this)

{
  uint8_t *info;
  code *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _Alloc_hider *p_Var3;
  int iVar4;
  EVP_MD *pEVar5;
  pointer peVar6;
  UniquePtr<EVP_PKEY_CTX> UVar7;
  ScopedTrace *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar8;
  uint8_t *puVar9;
  long lVar10;
  long lVar11;
  ulong info_len;
  bool bVar12;
  AssertionResult gtest_ar__1;
  UniquePtr<EVP_PKEY_CTX> copy;
  ScopedTrace gtest_trace_335;
  ScopedTrace gtest_trace_289;
  Bytes local_1a8;
  ScopedTrace gtest_trace_257;
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY_CTX> ctx;
  size_t len;
  bool copy_ctx;
  undefined1 uStack_159;
  size_t prk_len;
  AssertHelper local_150;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_148;
  size_t local_140;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  uint8_t *local_130;
  ulong local_128;
  uint8_t *local_120;
  size_t local_118;
  size_t local_110;
  uint8_t *local_108;
  undefined *local_100;
  uint8_t *local_f8;
  code *local_f0;
  uint8_t buf [82];
  uint8_t prk [64];
  
  local_128 = 0;
LAB_002b8a3b:
  this_01 = &gtest_ar_.message_;
  if (local_128 < 7) {
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&gtest_trace_257,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
               ,0x101,&local_128);
    lVar10 = local_128 * 0x1b8;
    pcVar1 = (code *)(&(anonymous_namespace)::kTests)[local_128 * 0x37];
    pEVar5 = (EVP_MD *)(*pcVar1)();
    local_108 = &UNK_006858b8 + lVar10;
    local_110 = *(size_t *)(&DAT_00685908 + lVar10);
    local_118 = *(size_t *)(&DAT_00685960 + lVar10);
    puVar9 = &UNK_00685910 + lVar10;
    local_120 = puVar9;
    iVar4 = HKDF_extract(prk,&prk_len,pEVar5,local_108,local_110,puVar9,local_118);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)buf,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "HKDF_extract(prk, &prk_len, test->md_func(), test->ikm, test->ikm_len, test->salt, test->salt_len)"
                 ,"false","true",(char *)puVar9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                 ,0x107,(char *)buf._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&gtest_ar__1)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      std::__cxx11::string::~string((string *)buf);
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
LAB_002b9eca:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_01);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_01);
      gtest_ar_._0_8_ = &DAT_006859c0 + lVar10;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             *)&((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(&DAT_00685a00 + lVar10))->
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ;
      gtest_ar__1._0_8_ = prk;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )prk_len;
      local_138._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           gtest_ar_.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_f8 = (uint8_t *)gtest_ar_._0_8_;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)buf,"Bytes(test->prk, test->prk_len)","Bytes(prk, prk_len)",
                 (Bytes *)&gtest_ar_,(Bytes *)&gtest_ar__1);
      if (buf[0] == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar8 = "";
        if (buf._8_8_ != 0) {
          pcVar8 = *(char **)buf._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x108,pcVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(buf + 8));
      pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (&DAT_00685a08 + lVar10);
      pEVar5 = (EVP_MD *)(*pcVar1)();
      puVar9 = &UNK_00685968 + lVar10;
      local_140 = *(size_t *)(&DAT_006859b8 + lVar10);
      local_130 = puVar9;
      iVar4 = HKDF_expand(buf,(size_t)pbVar2,pEVar5,prk,prk_len,puVar9,local_140);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar4 != 0;
      local_148._M_head_impl = pbVar2;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "HKDF_expand(buf, test->out_len, test->md_func(), prk, prk_len, test->info, test->info_len)"
                   ,"false","true",(char *)puVar9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ctx,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x10c,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&local_1a8);
LAB_002b9ea1:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_1a8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
        }
        this_01 = &gtest_ar__1.message_;
        goto LAB_002b9eca;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      gtest_ar__1._0_8_ = &DAT_00685a10 + lVar10;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )local_148._M_head_impl;
      local_1a8.span_.data_ = buf;
      local_1a8.span_.size_ = (size_t)local_148._M_head_impl;
      local_100 = (undefined *)gtest_ar__1._0_8_;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&gtest_ar_,"Bytes(test->out, test->out_len)",
                 "Bytes(buf, test->out_len)",(Bytes *)&gtest_ar__1,&local_1a8);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        pcVar8 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar8 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x10d,pcVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1a8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pEVar5 = (EVP_MD *)(*pcVar1)();
      puVar9 = local_120;
      iVar4 = HKDF(buf,(size_t)local_148._M_head_impl,pEVar5,local_108,local_110,local_120,local_118
                   ,local_130,local_140);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar4 != 0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "HKDF(buf, test->out_len, test->md_func(), test->ikm, test->ikm_len, test->salt, test->salt_len, test->info, test->info_len)"
                   ,"false","true",(char *)puVar9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ctx,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x111,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&local_1a8);
        goto LAB_002b9ea1;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      gtest_ar__1._0_8_ = local_100;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )local_148._M_head_impl;
      local_1a8.span_.data_ = buf;
      local_1a8.span_.size_ = (size_t)local_148._M_head_impl;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&gtest_ar_,"Bytes(test->out, test->out_len)",
                 "Bytes(buf, test->out_len)",(Bytes *)&gtest_ar__1,&local_1a8);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        pcVar8 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar8 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x112,pcVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1a8,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
           EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ =
           (tuple<evp_pkey_ctx_st_*,_bssl::internal::Deleter>)
           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_evp_pkey_ctx_st_*,_false>)0x0;
      if ((tuple<evp_pkey_ctx_st_*,_bssl::internal::Deleter>)
          ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_evp_pkey_ctx_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)0x49a3a2,"false"
                   ,"true",(char *)puVar9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&copy,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x117,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
LAB_002ba19c:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&copy);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_1a8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
        }
LAB_002ba1c5:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_derive_init
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",
                     (char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x118,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_hkdf_mode
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,1);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 1)","false","true",
                     (char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x11a,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        UVar7 = ctx;
        local_f0 = pcVar1;
        pEVar5 = (EVP_MD *)(*pcVar1)();
        iVar4 = EVP_PKEY_CTX_set_hkdf_md
                          ((EVP_PKEY_CTX *)
                           UVar7._M_t.
                           super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,pEVar5);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())",
                     "false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x11b,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_set1_hkdf_key
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,local_108,
                           local_110);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len)","false",
                     "true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x11d,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_set1_hkdf_salt
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,local_120,
                           local_118);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len)","false",
                     "true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x11f,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        local_150.data_._0_2_ = 0x100;
        pbVar2 = local_138._M_head_impl + -1;
        p_Var3 = &(local_138._M_head_impl)->_M_dataplus;
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          _copy_ctx = CONCAT11(uStack_159,*(undefined1 *)((long)&local_150.data_ + lVar11));
          testing::ScopedTrace::ScopedTrace<bool>
                    (&gtest_trace_289,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x121,&copy_ctx);
          copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
          UVar7 = ctx;
          if (copy_ctx == true) {
            peVar6 = (pointer)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)
                                               ctx._M_t.
                                               super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                               _M_head_impl);
            std::__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&copy,peVar6);
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__1.success_ =
                 (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
                 copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
                copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__1.message_);
              UVar7 = copy;
              goto LAB_002b9006;
            }
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)0x4b5626,
                       "false","true",(char *)puVar9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x126,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&local_1a8);
LAB_002b9c7d:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            if ((long *)local_1a8.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__1.message_);
            std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&copy);
            this_00 = &gtest_trace_289;
            goto LAB_002b9cbd;
          }
LAB_002b9006:
          prk_len = 0;
          iVar4 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                  UVar7._M_t.
                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,
                                  (uchar *)0x0,&prk_len);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__1.success_ = iVar4 != 0;
          if (iVar4 == 0) {
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"EVP_PKEY_derive(use_ctx, nullptr, &prk_len)","false",
                       "true",(char *)puVar9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,300,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&local_1a8);
            goto LAB_002b9c7d;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__1.message_);
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)&gtest_ar_,"prk_len","test->prk_len",&prk_len,
                     (unsigned_long *)(&DAT_00685a00 + lVar10));
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            pcVar8 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar8 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x12d,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1a8,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          prk_len = (size_t)((long)&pbVar2->field_2 + 0xf);
          iVar4 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                  UVar7._M_t.
                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,prk,
                                  &prk_len);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          bVar12 = iVar4 == 0;
          gtest_ar__1.success_ = bVar12;
          if (!bVar12) {
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","true","false",
                       (char *)puVar9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x131,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&local_1a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            if ((long *)local_1a8.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__1.message_);
          ERR_clear_error();
          prk[0x30] = '\0';
          prk[0x31] = '\0';
          prk[0x32] = '\0';
          prk[0x33] = '\0';
          prk[0x34] = '\0';
          prk[0x35] = '\0';
          prk[0x36] = '\0';
          prk[0x37] = '\0';
          prk[0x38] = '\0';
          prk[0x39] = '\0';
          prk[0x3a] = '\0';
          prk[0x3b] = '\0';
          prk[0x3c] = '\0';
          prk[0x3d] = '\0';
          prk[0x3e] = '\0';
          prk[0x3f] = '\0';
          prk[0x20] = '\0';
          prk[0x21] = '\0';
          prk[0x22] = '\0';
          prk[0x23] = '\0';
          prk[0x24] = '\0';
          prk[0x25] = '\0';
          prk[0x26] = '\0';
          prk[0x27] = '\0';
          prk[0x28] = '\0';
          prk[0x29] = '\0';
          prk[0x2a] = '\0';
          prk[0x2b] = '\0';
          prk[0x2c] = '\0';
          prk[0x2d] = '\0';
          prk[0x2e] = '\0';
          prk[0x2f] = '\0';
          prk[0x10] = '\0';
          prk[0x11] = '\0';
          prk[0x12] = '\0';
          prk[0x13] = '\0';
          prk[0x14] = '\0';
          prk[0x15] = '\0';
          prk[0x16] = '\0';
          prk[0x17] = '\0';
          prk[0x18] = '\0';
          prk[0x19] = '\0';
          prk[0x1a] = '\0';
          prk[0x1b] = '\0';
          prk[0x1c] = '\0';
          prk[0x1d] = '\0';
          prk[0x1e] = '\0';
          prk[0x1f] = '\0';
          prk[0] = '\0';
          prk[1] = '\0';
          prk[2] = '\0';
          prk[3] = '\0';
          prk[4] = '\0';
          prk[5] = '\0';
          prk[6] = '\0';
          prk[7] = '\0';
          prk[8] = '\0';
          prk[9] = '\0';
          prk[10] = '\0';
          prk[0xb] = '\0';
          prk[0xc] = '\0';
          prk[0xd] = '\0';
          prk[0xe] = '\0';
          prk[0xf] = '\0';
          prk_len = (size_t)local_138._M_head_impl;
          iVar4 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                  UVar7._M_t.
                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,prk,
                                  &prk_len);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__1.success_ = iVar4 != 0;
          if (iVar4 == 0) {
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","false","true",
                       (char *)puVar9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x137,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&local_1a8);
            goto LAB_002b9c7d;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__1.message_);
          gtest_ar__1._0_8_ = local_f8;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )local_138._M_head_impl;
          local_1a8.span_.data_ = prk;
          local_1a8.span_.size_ = prk_len;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)&gtest_ar_,"Bytes(test->prk, test->prk_len)","Bytes(prk, prk_len)",
                     (Bytes *)&gtest_ar__1,&local_1a8);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            pcVar8 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar8 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x138,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1a8,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          prk[0] = '\0';
          prk[1] = '\0';
          prk[2] = '\0';
          prk[3] = '\0';
          prk[4] = '\0';
          prk[5] = '\0';
          prk[6] = '\0';
          prk[7] = '\0';
          prk[8] = '\0';
          prk[9] = '\0';
          prk[10] = '\0';
          prk[0xb] = '\0';
          prk[0xc] = '\0';
          prk[0xd] = '\0';
          prk[0xe] = '\0';
          prk[0xf] = '\0';
          prk[0x10] = '\0';
          prk[0x11] = '\0';
          prk[0x12] = '\0';
          prk[0x13] = '\0';
          prk[0x14] = '\0';
          prk[0x15] = '\0';
          prk[0x16] = '\0';
          prk[0x17] = '\0';
          prk[0x18] = '\0';
          prk[0x19] = '\0';
          prk[0x1a] = '\0';
          prk[0x1b] = '\0';
          prk[0x1c] = '\0';
          prk[0x1d] = '\0';
          prk[0x1e] = '\0';
          prk[0x1f] = '\0';
          prk[0x20] = '\0';
          prk[0x21] = '\0';
          prk[0x22] = '\0';
          prk[0x23] = '\0';
          prk[0x24] = '\0';
          prk[0x25] = '\0';
          prk[0x26] = '\0';
          prk[0x27] = '\0';
          prk[0x28] = '\0';
          prk[0x29] = '\0';
          prk[0x2a] = '\0';
          prk[0x2b] = '\0';
          prk[0x2c] = '\0';
          prk[0x2d] = '\0';
          prk[0x2e] = '\0';
          prk[0x2f] = '\0';
          prk[0x30] = '\0';
          prk[0x31] = '\0';
          prk[0x32] = '\0';
          prk[0x33] = '\0';
          prk[0x34] = '\0';
          prk[0x35] = '\0';
          prk[0x36] = '\0';
          prk[0x37] = '\0';
          prk[0x38] = '\0';
          prk[0x39] = '\0';
          prk[0x3a] = '\0';
          prk[0x3b] = '\0';
          prk[0x3c] = '\0';
          prk[0x3d] = '\0';
          prk[0x3e] = '\0';
          prk[0x3f] = '\0';
          prk_len = (size_t)((long)&p_Var3->_M_p + 1);
          iVar4 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                  UVar7._M_t.
                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,prk,
                                  &prk_len);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__1.success_ = iVar4 != 0;
          if (iVar4 == 0) {
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"EVP_PKEY_derive(use_ctx, prk, &prk_len)","false","true",
                       (char *)puVar9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x13d,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&local_1a8);
            goto LAB_002b9c7d;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__1.message_);
          gtest_ar__1._0_8_ = local_f8;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )local_138._M_head_impl;
          local_1a8.span_.data_ = prk;
          local_1a8.span_.size_ = prk_len;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)&gtest_ar_,"Bytes(test->prk, test->prk_len)","Bytes(prk, prk_len)",
                     (Bytes *)&gtest_ar__1,&local_1a8);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            pcVar8 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar8 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x13e,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1a8,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&copy);
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_289);
        }
        peVar6 = (pointer)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
        std::__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&ctx,peVar6);
        pcVar1 = local_f0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ =
             (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
             ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
            ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)0x49a3a2,
                     "false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x142,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_derive_init
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",
                     (char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x143,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_hkdf_mode
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,2);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 2)","false","true",
                     (char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x145,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        UVar7 = ctx;
        pEVar5 = (EVP_MD *)(*pcVar1)();
        iVar4 = EVP_PKEY_CTX_set_hkdf_md
                          ((EVP_PKEY_CTX *)
                           UVar7._M_t.
                           super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,pEVar5);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())",
                     "false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x146,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_set1_hkdf_key
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,local_f8,
                           (size_t)local_138._M_head_impl);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->prk, test->prk_len)","false",
                     "true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x148,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        info_len = local_140 >> 1;
        iVar4 = EVP_PKEY_CTX_add1_hkdf_info
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,local_130,
                           info_len);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half)",
                     "false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x14b,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        info = local_130 + info_len;
        local_140 = local_140 - info_len;
        iVar4 = EVP_PKEY_CTX_add1_hkdf_info
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,info,
                           local_140);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half, test->info_len - half)"
                     ,"false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x14d,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        _copy_ctx = 0x100;
        for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
          gtest_trace_289 = *(ScopedTrace *)(&copy_ctx + lVar10);
          testing::ScopedTrace::ScopedTrace<bool>
                    (&gtest_trace_335,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x14f,(bool *)&gtest_trace_289);
          copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
          UVar7 = ctx;
          if (gtest_trace_289 == (ScopedTrace)0x1) {
            peVar6 = (pointer)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)
                                               ctx._M_t.
                                               super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                               _M_head_impl);
            std::__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&copy,peVar6);
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__1.success_ =
                 (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
                 copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
                copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&local_1a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)0x4b5626,
                         "false","true",(char *)puVar9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&len,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                         ,0x154,(char *)gtest_ar_._0_8_);
              testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&local_1a8)
              ;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if ((long *)local_1a8.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
              }
              goto LAB_002ba30b;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__1.message_);
            UVar7 = copy;
          }
          buf[0x40] = '\0';
          buf[0x41] = '\0';
          buf[0x42] = '\0';
          buf[0x43] = '\0';
          buf[0x44] = '\0';
          buf[0x45] = '\0';
          buf[0x46] = '\0';
          buf[0x47] = '\0';
          buf[0x48] = '\0';
          buf[0x49] = '\0';
          buf[0x4a] = '\0';
          buf[0x4b] = '\0';
          buf[0x4c] = '\0';
          buf[0x4d] = '\0';
          buf[0x4e] = '\0';
          buf[0x4f] = '\0';
          buf[0x30] = '\0';
          buf[0x31] = '\0';
          buf[0x32] = '\0';
          buf[0x33] = '\0';
          buf[0x34] = '\0';
          buf[0x35] = '\0';
          buf[0x36] = '\0';
          buf[0x37] = '\0';
          buf[0x38] = '\0';
          buf[0x39] = '\0';
          buf[0x3a] = '\0';
          buf[0x3b] = '\0';
          buf[0x3c] = '\0';
          buf[0x3d] = '\0';
          buf[0x3e] = '\0';
          buf[0x3f] = '\0';
          buf[0x20] = '\0';
          buf[0x21] = '\0';
          buf[0x22] = '\0';
          buf[0x23] = '\0';
          buf[0x24] = '\0';
          buf[0x25] = '\0';
          buf[0x26] = '\0';
          buf[0x27] = '\0';
          buf[0x28] = '\0';
          buf[0x29] = '\0';
          buf[0x2a] = '\0';
          buf[0x2b] = '\0';
          buf[0x2c] = '\0';
          buf[0x2d] = '\0';
          buf[0x2e] = '\0';
          buf[0x2f] = '\0';
          buf[0x10] = '\0';
          buf[0x11] = '\0';
          buf[0x12] = '\0';
          buf[0x13] = '\0';
          buf[0x14] = '\0';
          buf[0x15] = '\0';
          buf[0x16] = '\0';
          buf[0x17] = '\0';
          buf[0x18] = '\0';
          buf[0x19] = '\0';
          buf[0x1a] = '\0';
          buf[0x1b] = '\0';
          buf[0x1c] = '\0';
          buf[0x1d] = '\0';
          buf[0x1e] = '\0';
          buf[0x1f] = '\0';
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
          buf[4] = '\0';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          buf[8] = '\0';
          buf[9] = '\0';
          buf[10] = '\0';
          buf[0xb] = '\0';
          buf[0xc] = '\0';
          buf[0xd] = '\0';
          buf[0xe] = '\0';
          buf[0xf] = '\0';
          buf[0x50] = '\0';
          buf[0x51] = '\0';
          len = (size_t)local_148._M_head_impl;
          iVar4 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                  UVar7._M_t.
                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,buf,
                                  &len);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__1.success_ = iVar4 != 0;
          if (iVar4 == 0) {
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"EVP_PKEY_derive(use_ctx, buf, &len)","false","true",
                       (char *)puVar9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x159,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1a8);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            if ((long *)local_1a8.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
            }
            goto LAB_002ba30b;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__1.message_);
          gtest_ar__1._0_8_ = local_100;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )local_148._M_head_impl;
          local_1a8.span_.data_ = buf;
          local_1a8.span_.size_ = len;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)&gtest_ar_,"Bytes(test->out, test->out_len)","Bytes(buf, len)",
                     (Bytes *)&gtest_ar__1,&local_1a8);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            pcVar8 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar8 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x15a,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1a8,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&copy);
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_335);
        }
        peVar6 = (pointer)EVP_PKEY_CTX_new_id(0x3c3,(ENGINE *)0x0);
        std::__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&ctx,peVar6);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ =
             (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
             ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
            ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)0x49a3a2,
                     "false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x15e,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_derive_init
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_derive_init(ctx.get())","false","true",
                     (char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x15f,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_hkdf_mode
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,0);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_CTX_hkdf_mode(ctx.get(), 0)","false","true",
                     (char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x161,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        UVar7 = ctx;
        pEVar5 = (EVP_MD *)(*local_f0)();
        iVar4 = EVP_PKEY_CTX_set_hkdf_md
                          ((EVP_PKEY_CTX *)
                           UVar7._M_t.
                           super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,pEVar5);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func())",
                     "false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x162,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_set1_hkdf_key
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,local_108,
                           local_110);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len)","false",
                     "true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x164,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_set1_hkdf_salt
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,local_120,
                           local_118);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len)","false",
                     "true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x166,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          goto LAB_002ba19c;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_add1_hkdf_info
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,local_130,
                           info_len);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)"EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half)",
                     "false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x168,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&copy);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if ((long *)local_1a8.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
          }
          goto LAB_002ba1c5;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        iVar4 = EVP_PKEY_CTX_add1_hkdf_info
                          ((EVP_PKEY_CTX *)
                           ctx._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,info,
                           local_140);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ = iVar4 != 0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                     (AssertionResult *)
                     "EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half, test->info_len - half)"
                     ,"false","true",(char *)puVar9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&copy,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                     ,0x16a,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&copy,(Message *)&local_1a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&copy);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if ((long *)local_1a8.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
          }
          goto LAB_002ba1c5;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        _copy_ctx = 0x100;
        lVar10 = 0;
LAB_002b98f7:
        if (lVar10 == 2) goto LAB_002b9ab9;
        gtest_trace_289 = *(ScopedTrace *)(&copy_ctx + lVar10);
        testing::ScopedTrace::ScopedTrace<bool>
                  (&gtest_trace_335,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x16c,(bool *)&gtest_trace_289);
        copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
        UVar7 = ctx;
        if (gtest_trace_289 != (ScopedTrace)0x1) {
LAB_002b9970:
          buf[0x40] = '\0';
          buf[0x41] = '\0';
          buf[0x42] = '\0';
          buf[0x43] = '\0';
          buf[0x44] = '\0';
          buf[0x45] = '\0';
          buf[0x46] = '\0';
          buf[0x47] = '\0';
          buf[0x48] = '\0';
          buf[0x49] = '\0';
          buf[0x4a] = '\0';
          buf[0x4b] = '\0';
          buf[0x4c] = '\0';
          buf[0x4d] = '\0';
          buf[0x4e] = '\0';
          buf[0x4f] = '\0';
          buf[0x30] = '\0';
          buf[0x31] = '\0';
          buf[0x32] = '\0';
          buf[0x33] = '\0';
          buf[0x34] = '\0';
          buf[0x35] = '\0';
          buf[0x36] = '\0';
          buf[0x37] = '\0';
          buf[0x38] = '\0';
          buf[0x39] = '\0';
          buf[0x3a] = '\0';
          buf[0x3b] = '\0';
          buf[0x3c] = '\0';
          buf[0x3d] = '\0';
          buf[0x3e] = '\0';
          buf[0x3f] = '\0';
          buf[0x20] = '\0';
          buf[0x21] = '\0';
          buf[0x22] = '\0';
          buf[0x23] = '\0';
          buf[0x24] = '\0';
          buf[0x25] = '\0';
          buf[0x26] = '\0';
          buf[0x27] = '\0';
          buf[0x28] = '\0';
          buf[0x29] = '\0';
          buf[0x2a] = '\0';
          buf[0x2b] = '\0';
          buf[0x2c] = '\0';
          buf[0x2d] = '\0';
          buf[0x2e] = '\0';
          buf[0x2f] = '\0';
          buf[0x10] = '\0';
          buf[0x11] = '\0';
          buf[0x12] = '\0';
          buf[0x13] = '\0';
          buf[0x14] = '\0';
          buf[0x15] = '\0';
          buf[0x16] = '\0';
          buf[0x17] = '\0';
          buf[0x18] = '\0';
          buf[0x19] = '\0';
          buf[0x1a] = '\0';
          buf[0x1b] = '\0';
          buf[0x1c] = '\0';
          buf[0x1d] = '\0';
          buf[0x1e] = '\0';
          buf[0x1f] = '\0';
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
          buf[4] = '\0';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          buf[8] = '\0';
          buf[9] = '\0';
          buf[10] = '\0';
          buf[0xb] = '\0';
          buf[0xc] = '\0';
          buf[0xd] = '\0';
          buf[0xe] = '\0';
          buf[0xf] = '\0';
          buf[0x50] = '\0';
          buf[0x51] = '\0';
          len = (size_t)local_148._M_head_impl;
          iVar4 = EVP_PKEY_derive((EVP_PKEY_CTX *)
                                  UVar7._M_t.
                                  super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl,buf,
                                  &len);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__1.success_ = iVar4 != 0;
          if (iVar4 == 0) {
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                       (AssertionResult *)"EVP_PKEY_derive(use_ctx, buf, &len)","false","true",
                       (char *)puVar9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x176,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_1a8);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            if ((long *)local_1a8.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
            }
            goto LAB_002ba30b;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__1.message_);
          gtest_ar__1._0_8_ = local_100;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )local_148._M_head_impl;
          local_1a8.span_.data_ = buf;
          local_1a8.span_.size_ = len;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)&gtest_ar_,"Bytes(test->out, test->out_len)","Bytes(buf, len)",
                     (Bytes *)&gtest_ar__1,&local_1a8);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            pcVar8 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar8 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                       ,0x177,pcVar8);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_1a8,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&copy);
          testing::ScopedTrace::~ScopedTrace(&gtest_trace_335);
          lVar10 = lVar10 + 1;
          goto LAB_002b98f7;
        }
        peVar6 = (pointer)EVP_PKEY_CTX_dup((EVP_PKEY_CTX *)
                                           ctx._M_t.
                                           super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>.
                                           _M_head_impl);
        std::__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter> *)&copy,peVar6);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__1.success_ =
             (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
             copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)
            copy._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>)0x0) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__1.message_);
          UVar7 = copy;
          goto LAB_002b9970;
        }
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)0x4b5626,"false"
                   ,"true",(char *)puVar9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&len,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/hkdf/hkdf_test.cc"
                   ,0x171,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&len,(Message *)&local_1a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if ((long *)local_1a8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
        }
LAB_002ba30b:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&copy);
        this_00 = &gtest_trace_335;
LAB_002b9cbd:
        testing::ScopedTrace::~ScopedTrace(this_00);
      }
      std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
    }
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_257);
  }
  return;
LAB_002b9ab9:
  std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_257);
  local_128 = local_128 + 1;
  goto LAB_002b8a3b;
}

Assistant:

TEST(HKDFTest, TestVectors) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTests); i++) {
    SCOPED_TRACE(i);
    const HKDFTestVector *test = &kTests[i];

    uint8_t prk[EVP_MAX_MD_SIZE];
    size_t prk_len;
    ASSERT_TRUE(HKDF_extract(prk, &prk_len, test->md_func(), test->ikm,
                             test->ikm_len, test->salt, test->salt_len));
    EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));

    uint8_t buf[82];
    ASSERT_TRUE(HKDF_expand(buf, test->out_len, test->md_func(), prk, prk_len,
                            test->info, test->info_len));
    EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, test->out_len));

    ASSERT_TRUE(HKDF(buf, test->out_len, test->md_func(), test->ikm,
                     test->ikm_len, test->salt, test->salt_len, test->info,
                     test->info_len));
    EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, test->out_len));

    // Repeat the test with the OpenSSL compatibility |EVP_PKEY_derive| API.
    bssl::UniquePtr<EVP_PKEY_CTX> ctx(
        EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_hkdf_mode(ctx.get(), EVP_PKEY_HKDEF_MODE_EXTRACT_ONLY));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }

      // A null output should report the length.
      prk_len = 0;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, nullptr, &prk_len));
      EXPECT_EQ(prk_len, test->prk_len);

      // Too small of a buffer should cleanly fail.
      prk_len = test->prk_len - 1;
      EXPECT_FALSE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      ERR_clear_error();

      // Test the correct buffer size.
      OPENSSL_memset(prk, 0, sizeof(prk));
      prk_len = test->prk_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));

      // Test a larger buffer than necessary.
      OPENSSL_memset(prk, 0, sizeof(prk));
      prk_len = test->prk_len + 1;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, prk, &prk_len));
      EXPECT_EQ(Bytes(test->prk, test->prk_len), Bytes(prk, prk_len));
    }

    ctx.reset(EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_hkdf_mode(ctx.get(), EVP_PKEY_HKDEF_MODE_EXPAND_ONLY));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->prk, test->prk_len));
    // |info| can be passed in multiple parts.
    size_t half = test->info_len / 2;
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half));
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half,
                                            test->info_len - half));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }
      OPENSSL_memset(buf, 0, sizeof(buf));
      size_t len = test->out_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, buf, &len));
      EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, len));
    }

    ctx.reset(EVP_PKEY_CTX_new_id(EVP_PKEY_HKDF, nullptr));
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(EVP_PKEY_derive_init(ctx.get()));
    ASSERT_TRUE(EVP_PKEY_CTX_hkdf_mode(ctx.get(),
                                       EVP_PKEY_HKDEF_MODE_EXTRACT_AND_EXPAND));
    ASSERT_TRUE(EVP_PKEY_CTX_set_hkdf_md(ctx.get(), test->md_func()));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_key(ctx.get(), test->ikm, test->ikm_len));
    ASSERT_TRUE(
        EVP_PKEY_CTX_set1_hkdf_salt(ctx.get(), test->salt, test->salt_len));
    // |info| can be passed in multiple parts.
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info, half));
    ASSERT_TRUE(EVP_PKEY_CTX_add1_hkdf_info(ctx.get(), test->info + half,
                                            test->info_len - half));
    for (bool copy_ctx : {false, true}) {
      SCOPED_TRACE(copy_ctx);
      bssl::UniquePtr<EVP_PKEY_CTX> copy;
      EVP_PKEY_CTX *use_ctx = ctx.get();
      if (copy_ctx) {
        copy.reset(EVP_PKEY_CTX_dup(ctx.get()));
        ASSERT_TRUE(copy);
        use_ctx = copy.get();
      }
      OPENSSL_memset(buf, 0, sizeof(buf));
      size_t len = test->out_len;
      ASSERT_TRUE(EVP_PKEY_derive(use_ctx, buf, &len));
      EXPECT_EQ(Bytes(test->out, test->out_len), Bytes(buf, len));
    }
  }
}